

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties_print.c
# Opt level: O1

ssize_t saveString(void *ctx,char *str,size_t len)

{
  void *__dest;
  size_t sVar1;
  iovec *vec;
  
  sVar1 = 0xfffffffffffffff0;
  if (len < *(ulong *)((long)ctx + 8)) {
    __dest = *ctx;
    memcpy(__dest,str,len);
    *(size_t *)ctx = (long)__dest + len;
    *(long *)((long)ctx + 8) = *(long *)((long)ctx + 8) - len;
    sVar1 = len;
  }
  return sVar1;
}

Assistant:

static ssize_t saveString(void *ctx, const char *str, size_t len)
{
	struct iovec *vec = ctx;
	char *to;
	
	if (len >= vec->iov_len) {
		return MPT_ERROR(MissingData);
	}
	to = memcpy(vec->iov_base, str, len);
	
	vec->iov_base = to + len;
	vec->iov_len -= len;
	
	return len;
}